

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

xmlChar * xmlStrncatNew(xmlChar *str1,xmlChar *str2,int len)

{
  uint uVar1;
  xmlChar *pxVar2;
  ulong __n;
  ulong __n_00;
  
  if ((len < 0) && (len = xmlStrlen(str2), len < 0)) {
    return (xmlChar *)0x0;
  }
  if (str2 == (xmlChar *)0x0 || len == 0) {
    pxVar2 = xmlStrdup(str1);
    return pxVar2;
  }
  if (str1 != (xmlChar *)0x0) {
    uVar1 = xmlStrlen(str1);
    if ((len ^ 0x7fffffffU) < uVar1) {
      return (xmlChar *)0x0;
    }
    __n = (ulong)uVar1;
    __n_00 = (ulong)(uint)len;
    pxVar2 = (xmlChar *)(*xmlMalloc)(__n + __n_00 + 1);
    if (pxVar2 != (xmlChar *)0x0) {
      memcpy(pxVar2,str1,__n);
      memcpy(pxVar2 + __n,str2,__n_00);
      pxVar2[__n_00 + __n] = '\0';
      return pxVar2;
    }
    xmlErrMemory((xmlParserCtxtPtr)0x0,(char *)0x0);
    str2 = str1;
    len = uVar1;
  }
  pxVar2 = xmlStrndup(str2,len);
  return pxVar2;
}

Assistant:

xmlChar *
xmlStrncatNew(const xmlChar *str1, const xmlChar *str2, int len) {
    int size;
    xmlChar *ret;

    if (len < 0) {
        len = xmlStrlen(str2);
        if (len < 0)
            return(NULL);
    }
    if ((str2 == NULL) || (len == 0))
        return(xmlStrdup(str1));
    if (str1 == NULL)
        return(xmlStrndup(str2, len));

    size = xmlStrlen(str1);
    if ((size < 0) || (size > INT_MAX - len))
        return(NULL);
    ret = (xmlChar *) xmlMalloc((size_t) size + len + 1);
    if (ret == NULL) {
        xmlErrMemory(NULL, NULL);
        return(xmlStrndup(str1, size));
    }
    memcpy(ret, str1, size);
    memcpy(&ret[size], str2, len);
    ret[size + len] = 0;
    return(ret);
}